

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_quantization_transform.cc
# Opt level: O2

bool __thiscall
draco::AttributeQuantizationTransform::DecodeParameters
          (AttributeQuantizationTransform *this,PointAttribute *attribute,
          DecoderBuffer *decoder_buffer)

{
  pointer out_data;
  bool bVar1;
  undefined8 in_RAX;
  uint8_t quantization_bits;
  byte local_11;
  
  local_11 = (byte)((ulong)in_RAX >> 0x38);
  std::vector<float,_std::allocator<float>_>::resize
            (&this->min_values_,(ulong)(attribute->super_GeometryAttribute).num_components_);
  out_data = (this->min_values_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
  bVar1 = DecoderBuffer::Decode
                    (decoder_buffer,out_data,
                     (long)(this->min_values_).super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)out_data);
  if ((((bVar1) && (bVar1 = DecoderBuffer::Decode<float>(decoder_buffer,&this->range_), bVar1)) &&
      (bVar1 = DecoderBuffer::Decode<unsigned_char>(decoder_buffer,&local_11), bVar1)) &&
     (local_11 - 1 < 0x1e)) {
    this->quantization_bits_ = (uint)local_11;
    return true;
  }
  return false;
}

Assistant:

bool AttributeQuantizationTransform::DecodeParameters(
    const PointAttribute &attribute, DecoderBuffer *decoder_buffer) {
  min_values_.resize(attribute.num_components());
  if (!decoder_buffer->Decode(&min_values_[0],
                              sizeof(float) * min_values_.size())) {
    return false;
  }
  if (!decoder_buffer->Decode(&range_)) {
    return false;
  }
  uint8_t quantization_bits;
  if (!decoder_buffer->Decode(&quantization_bits)) {
    return false;
  }
  if (!IsQuantizationValid(quantization_bits)) {
    return false;
  }
  quantization_bits_ = quantization_bits;
  return true;
}